

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightParameters.cpp
# Opt level: O2

void __thiscall OpenMD::Perturbations::LightParameters::LightParameters(LightParameters *this)

{
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_a1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_80;
  ParameterBase *local_58;
  ParameterBase *local_50;
  ParameterBase *local_48;
  ParameterBase *local_40;
  ParameterBase *local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__LightParameters_002bd010;
  (this->UseLight).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseLight).super_ParameterBase.keyword_.field_2;
  (this->UseLight).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseLight).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseLight).super_ParameterBase.optional_ = false;
  (this->UseLight).super_ParameterBase.defaultValue_ = false;
  local_38 = &(this->UseLight).super_ParameterBase;
  (this->UseLight).super_ParameterBase.empty_ = true;
  (this->UseLight).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bbb98;
  local_40 = &(this->Wavelength).super_ParameterBase;
  (this->Wavelength).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Wavelength).super_ParameterBase.keyword_.field_2;
  (this->Wavelength).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Wavelength).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Wavelength).super_ParameterBase.optional_ = false;
  (this->Wavelength).super_ParameterBase.defaultValue_ = false;
  (this->Wavelength).super_ParameterBase.empty_ = true;
  (this->Wavelength).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bbc10;
  (this->Frequency).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Frequency).super_ParameterBase.keyword_.field_2;
  (this->Frequency).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Frequency).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Frequency).super_ParameterBase.optional_ = false;
  (this->Frequency).super_ParameterBase.defaultValue_ = false;
  local_48 = &(this->Frequency).super_ParameterBase;
  (this->Frequency).super_ParameterBase.empty_ = true;
  (this->Frequency).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bbc10;
  local_50 = &(this->PropagationDirection).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_50);
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter(&this->WaveVector);
  (this->Intensity).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Intensity).super_ParameterBase.keyword_.field_2;
  (this->Intensity).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Intensity).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Intensity).super_ParameterBase.optional_ = false;
  (this->Intensity).super_ParameterBase.defaultValue_ = false;
  local_58 = &(this->Intensity).super_ParameterBase;
  (this->Intensity).super_ParameterBase.empty_ = true;
  (this->Intensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bbc10;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(&this->Polarization);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"useLight",(allocator<char> *)&local_a0);
  std::__cxx11::string::_M_assign((string *)&(this->UseLight).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_80);
  (this->UseLight).super_ParameterBase.optional_ = true;
  (this->UseLight).super_ParameterBase.defaultValue_ = true;
  (this->UseLight).super_ParameterBase.empty_ = false;
  (this->UseLight).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"useLight",&local_a1);
  local_80.first._M_string_length = local_98;
  this_00 = &(this->super_DataHolder).parameters_;
  paVar1 = &local_80.first.field_2;
  if (local_a0 == &local_90) {
    local_80.first.field_2._8_8_ = local_90._8_8_;
    local_80.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80.second = local_38;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"wavelength",(allocator<char> *)&local_a0);
  std::__cxx11::string::_M_assign((string *)&(this->Wavelength).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_80);
  (this->Wavelength).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"wavelength",&local_a1);
  local_80.first._M_string_length = local_98;
  if (local_a0 == &local_90) {
    local_80.first.field_2._8_8_ = local_90._8_8_;
    local_80.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_80.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80.second = local_40;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"frequency",(allocator<char> *)&local_a0);
  std::__cxx11::string::_M_assign((string *)&(this->Frequency).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_80);
  (this->Frequency).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"frequency",&local_a1);
  local_80.first._M_string_length = local_98;
  if (local_a0 == &local_90) {
    local_80.first.field_2._8_8_ = local_90._8_8_;
    local_80.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_80.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80.second = local_48;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"propagationDirection",(allocator<char> *)&local_a0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->PropagationDirection).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_80);
  (this->PropagationDirection).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"propagationDirection",&local_a1);
  local_80.first._M_string_length = local_98;
  if (local_a0 == &local_90) {
    local_80.first.field_2._8_8_ = local_90._8_8_;
    local_80.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_80.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80.second = local_50;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"waveVector",(allocator<char> *)&local_a0);
  std::__cxx11::string::_M_assign((string *)&(this->WaveVector).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_80);
  (this->WaveVector).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"waveVector",&local_a1);
  local_80.first._M_string_length = local_98;
  if (local_a0 == &local_90) {
    local_80.first.field_2._8_8_ = local_90._8_8_;
    local_80.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_80.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_a0 = &local_90;
  local_80.second = &(this->WaveVector).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"intensity",(allocator<char> *)&local_a0);
  std::__cxx11::string::_M_assign((string *)&(this->Intensity).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_80);
  (this->Intensity).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"intensity",&local_a1);
  local_80.first._M_string_length = local_98;
  if (local_a0 == &local_90) {
    local_80.first.field_2._8_8_ = local_90._8_8_;
    local_80.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_80.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80.second = local_58;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"polarization",(allocator<char> *)&local_a0);
  std::__cxx11::string::_M_assign((string *)&(this->Polarization).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_80);
  (this->Polarization).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"polarization",&local_a1);
  local_80.first._M_string_length = local_98;
  if (local_a0 == &local_90) {
    local_80.first.field_2._8_8_ = local_90._8_8_;
    local_80.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_80.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_a0 = &local_90;
  local_80.second = &(this->Polarization).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

LightParameters::LightParameters() {
    DefineOptionalParameterWithDefaultValue(UseLight, "useLight", false);
    DefineOptionalParameter(Wavelength, "wavelength");
    DefineOptionalParameter(Frequency, "frequency");
    DefineOptionalParameter(PropagationDirection, "propagationDirection");
    DefineOptionalParameter(WaveVector, "waveVector");
    DefineOptionalParameter(Intensity, "intensity");
    DefineOptionalParameter(Polarization, "polarization");
  }